

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodePtr xmlXPathNextChildElement(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlElementType xVar1;
  xmlDoc *doc;
  xmlNodePtr pxVar2;
  _xmlNode *p_Var3;
  
  if ((ctxt != (xmlXPathParserContextPtr)0x0) && (ctxt->context != (xmlXPathContextPtr)0x0)) {
    if (cur == (xmlNodePtr)0x0) {
      doc = (xmlDoc *)ctxt->context->node;
      if (doc != (xmlDoc *)0x0) {
        xVar1 = doc->type;
        if (XML_HTML_DOCUMENT_NODE < xVar1) {
          return (xmlNodePtr)0x0;
        }
        if ((0x862U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
          if ((0x2200U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
            return (xmlNodePtr)0x0;
          }
          pxVar2 = xmlDocGetRootElement(doc);
          return pxVar2;
        }
        for (p_Var3 = doc->children; p_Var3 != (_xmlNode *)0x0; p_Var3 = p_Var3->next) {
          if (p_Var3->type == XML_ELEMENT_NODE) {
            return p_Var3;
          }
        }
      }
    }
    else {
      if (XML_XINCLUDE_END < cur->type) {
        return (xmlNodePtr)0x0;
      }
      if ((0x1001faU >> (cur->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
        return (xmlNodePtr)0x0;
      }
      for (pxVar2 = cur->next; pxVar2 != (xmlNodePtr)0x0; pxVar2 = pxVar2->next) {
        if (pxVar2->type == XML_ELEMENT_NODE) {
          return pxVar2;
        }
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

static xmlNodePtr
xmlXPathNextChildElement(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL) {
	cur = ctxt->context->node;
	if (cur == NULL) return(NULL);
	/*
	* Get the first element child.
	*/
	switch (cur->type) {
            case XML_ELEMENT_NODE:
	    case XML_DOCUMENT_FRAG_NODE:
	    case XML_ENTITY_REF_NODE: /* URGENT TODO: entify-refs as well? */
            case XML_ENTITY_NODE:
		cur = cur->children;
		if (cur != NULL) {
		    if (cur->type == XML_ELEMENT_NODE)
			return(cur);
		    do {
			cur = cur->next;
		    } while ((cur != NULL) &&
			(cur->type != XML_ELEMENT_NODE));
		    return(cur);
		}
		return(NULL);
            case XML_DOCUMENT_NODE:
            case XML_HTML_DOCUMENT_NODE:
		return(xmlDocGetRootElement((xmlDocPtr) cur));
	    default:
		return(NULL);
	}
	return(NULL);
    }
    /*
    * Get the next sibling element node.
    */
    switch (cur->type) {
	case XML_ELEMENT_NODE:
	case XML_TEXT_NODE:
	case XML_ENTITY_REF_NODE:
	case XML_ENTITY_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_PI_NODE:
	case XML_COMMENT_NODE:
	case XML_XINCLUDE_END:
	    break;
	/* case XML_DTD_NODE: */ /* URGENT TODO: DTD-node as well? */
	default:
	    return(NULL);
    }
    if (cur->next != NULL) {
	if (cur->next->type == XML_ELEMENT_NODE)
	    return(cur->next);
	cur = cur->next;
	do {
	    cur = cur->next;
	} while ((cur != NULL) && (cur->type != XML_ELEMENT_NODE));
	return(cur);
    }
    return(NULL);
}